

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O1

int zt_mem_page_destroy(zt_mem_page *page)

{
  zt_mem_pool *pzVar1;
  size_t sVar2;
  zt_mem_page *pzVar3;
  zt_elist *pzVar4;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  int extraout_EAX;
  int iVar8;
  int extraout_EAX_00;
  unsigned_long uVar9;
  zt_mem_page *pzVar10;
  
  pzVar1 = page->parent_pool;
  if (page->num_free_elts < pzVar1->elts_per_page) {
    iVar8 = printf("error: %s called when elements are still in use!\n","zt_mem_page_destroy");
    return iVar8;
  }
  lVar6 = pzVar1->nfree_pages - 1;
  lVar7 = pzVar1->npages - 1;
  auVar5._8_4_ = (int)lVar7;
  auVar5._0_8_ = lVar6;
  auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
  pzVar1->nfree_pages = lVar6;
  pzVar1->npages = auVar5._8_8_;
  uVar9 = page->num_free_elts;
  if (uVar9 != 0) {
    sVar2 = pzVar1->elt_size;
    pzVar10 = page + 1;
    do {
      pzVar3 = (zt_mem_page *)(pzVar10->page_list).next;
      if (pzVar3 != pzVar10) {
        pzVar4 = (pzVar10->page_list).prev;
        (pzVar3->page_list).prev = pzVar4;
        pzVar4->next = (zt_elist *)pzVar3;
      }
      pzVar10 = (zt_mem_page *)((long)&pzVar10->num_free_elts + sVar2);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pzVar10 = (zt_mem_page *)(page->page_list).next;
  if (pzVar10 != page) {
    pzVar4 = (page->page_list).prev;
    (pzVar10->page_list).prev = pzVar4;
    pzVar4->next = (zt_elist *)pzVar10;
    free(page);
    return extraout_EAX_00;
  }
  free(page);
  return extraout_EAX;
}

Assistant:

static int
zt_mem_page_destroy(zt_mem_page *page)
{
    zt_mem_elt * elt;
    unsigned long i;
    size_t       size;

    if (page->num_free_elts < page->parent_pool->elts_per_page) {
        printf("error: %s called when elements are still in use!\n", ZT_LOG_FUNCTION);
        return 1;
    }

    page->parent_pool->npages--;
    page->parent_pool->nfree_pages--;

    size = sizeof(zt_mem_elt) + page->parent_pool->elt_size;
    elt = (zt_mem_elt *)page->data;
    /* remove the elements from the free element list */
    for (i = 0; i < page->num_free_elts; i++) {
        if (zt_elist_empty(&elt->free_elt_list) == 0) {
            zt_elist_remove(&elt->free_elt_list);
        }
        elt = (zt_mem_elt *)((unsigned long)elt + size);
    }
    /* remove the page from the page list */
    if (zt_elist_empty(&page->page_list) == 0) {
        zt_elist_remove(&page->page_list);
    }
    GLOBAL_zmt.dealloc(page);
    return 0;
}